

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::MultisampleShadeCountRenderCase::verifyImage
          (MultisampleShadeCountRenderCase *this,Surface *resultImage)

{
  RenderTarget RVar1;
  uint uVar2;
  int iVar3;
  TestLog *pTVar4;
  MultisampleShadeCountRenderCase *pMVar5;
  RenderTarget *pRVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  ConstPixelBufferAccess *access;
  void *__buf;
  int iVar10;
  int y;
  int x;
  int iVar11;
  allocator<char> local_2e6;
  allocator<char> local_2e5;
  int local_2e4;
  MultisampleShadeCountRenderCase *local_2e0;
  map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  shadeFrequency;
  string local_2a8;
  string local_288;
  ConstPixelBufferAccess local_268;
  LogImage local_240;
  deUint32 packed;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  
  RVar1 = (this->super_MultisampleRenderCase).m_renderTarget;
  iVar10 = 2;
  if ((RVar1 == TARGET_DEFAULT) || ((this->super_MultisampleRenderCase).m_numRequestedSamples != 0))
  {
    if (RVar1 == TARGET_DEFAULT) {
      pRVar6 = Context::getRenderTarget
                         ((this->super_MultisampleRenderCase).super_TestCase.m_context);
      if (pRVar6->m_numSamples < 2) goto LAB_00438df8;
    }
    iVar10 = (this->super_MultisampleRenderCase).m_numTargetSamples + 1;
  }
LAB_00438df8:
  shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar4 = ((this->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"ResultImage",&local_2e5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Result Image",&local_2e6)
  ;
  tcu::Surface::getAccess(&local_268,resultImage);
  access = &local_268;
  tcu::LogImage::LogImage(&local_240,&local_288,&local_2a8,access,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_240,(int)pTVar4,__buf,(size_t)access);
  _packed = pTVar4;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_2e0 = this;
  std::operator<<((ostream *)local_1a8,"Verifying image has (at least) ");
  std::ostream::operator<<(local_1a8,iVar10);
  std::operator<<((ostream *)local_1a8," different shades.\n");
  std::operator<<((ostream *)local_1a8,
                  "Excluding pixels with no full coverage (pixels on the shared edge of the triangle pair)."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&packed,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_2e4 = iVar10;
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  tcu::LogImage::~LogImage(&local_240);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  for (iVar10 = 0; pMVar5 = local_2e0, iVar10 != 0x80; iVar10 = iVar10 + 1) {
    for (iVar11 = 0; iVar11 != 0x80; iVar11 = iVar11 + 1) {
      uVar2 = *(uint *)((long)(resultImage->m_pixels).m_ptr +
                       (long)(resultImage->m_width * iVar10 + iVar11) * 4);
      _packed = (TestLog *)CONCAT44(uStack_1ac,(uVar2 & 0xff00) << 8 | uVar2 & 0xffff);
      if (iVar10 != iVar11) {
        iVar7 = std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                ::find(&shadeFrequency._M_t,&packed);
        if ((_Rb_tree_header *)iVar7._M_node == &shadeFrequency._M_t._M_impl.super__Rb_tree_header)
        {
          pmVar8 = std::
                   map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                 *)&shadeFrequency._M_t,&packed);
          *pmVar8 = 1;
        }
        else {
          pmVar8 = std::
                   map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                 *)&shadeFrequency._M_t,&packed);
          iVar3 = *pmVar8;
          pmVar8 = std::
                   map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::operator[]((map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                                 *)&shadeFrequency._M_t,&packed);
          *pmVar8 = iVar3 + 1;
        }
      }
    }
  }
  iVar10 = 0;
  for (p_Var9 = shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &shadeFrequency._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    iVar10 = iVar10 + (uint)(*(int *)&p_Var9[1].field_0x4 < 100);
  }
  _packed = ((pMVar5->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.
            m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Found ");
  std::ostream::operator<<
            (local_1a8,(int)shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::operator<<((ostream *)local_1a8," different shades.\n");
  std::operator<<((ostream *)local_1a8,"\tRare (less than ");
  std::ostream::operator<<(local_1a8,100);
  std::operator<<((ostream *)local_1a8," pixels): ");
  std::ostream::operator<<(local_1a8,iVar10);
  std::operator<<((ostream *)local_1a8,"\n");
  std::operator<<((ostream *)local_1a8,"\tCommon: ");
  std::ostream::operator<<
            (local_1a8,(int)shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count - iVar10
            );
  std::operator<<((ostream *)local_1a8,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&packed,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  iVar10 = local_2e4;
  iVar11 = (int)shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((int)shadeFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count < local_2e4) {
    _packed = ((pMVar5->super_MultisampleRenderCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"Image verification failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&packed,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree(&shadeFrequency._M_t);
  return iVar10 <= iVar11;
}

Assistant:

bool MultisampleShadeCountRenderCase::verifyImage (const tcu::Surface& resultImage)
{
	const bool				isSingleSampleTarget	= (m_renderTarget != TARGET_DEFAULT && m_numRequestedSamples == 0) || (m_renderTarget == TARGET_DEFAULT && m_context.getRenderTarget().getNumSamples() <= 1);
	const int				numShadesRequired		= (isSingleSampleTarget) ? (2) : (m_numTargetSamples + 1);
	const int				rareThreshold			= 100;
	int						rareCount				= 0;
	std::map<deUint32, int>	shadeFrequency;

	m_testCtx.getLog()
		<< tcu::TestLog::Image("ResultImage", "Result Image", resultImage.getAccess())
		<< tcu::TestLog::Message
		<< "Verifying image has (at least) " << numShadesRequired << " different shades.\n"
		<< "Excluding pixels with no full coverage (pixels on the shared edge of the triangle pair)."
		<< tcu::TestLog::EndMessage;

	for (int y = 0; y < RENDER_SIZE; ++y)
	for (int x = 0; x < RENDER_SIZE; ++x)
	{
		const tcu::RGBA	color	= resultImage.getPixel(x, y);
		const deUint32	packed	= ((deUint32)color.getRed()) + ((deUint32)color.getGreen() << 8) + ((deUint32)color.getGreen() << 16);

		// on the triangle edge, skip
		if (x == y)
			continue;

		if (shadeFrequency.find(packed) == shadeFrequency.end())
			shadeFrequency[packed] = 1;
		else
			shadeFrequency[packed] = shadeFrequency[packed] + 1;
	}

	for (std::map<deUint32, int>::const_iterator it = shadeFrequency.begin(); it != shadeFrequency.end(); ++it)
		if (it->second < rareThreshold)
			rareCount++;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Found " << (int)shadeFrequency.size() << " different shades.\n"
		<< "\tRare (less than " << rareThreshold << " pixels): " << rareCount << "\n"
		<< "\tCommon: " << (int)shadeFrequency.size() - rareCount << "\n"
		<< tcu::TestLog::EndMessage;

	if ((int)shadeFrequency.size() < numShadesRequired)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}